

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d536::TestCanSetAndGetResults::~TestCanSetAndGetResults
          (TestCanSetAndGetResults *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CanSetAndGetResults)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		UnitTest::TestResults results;
		UnitTest::CurrentTest::Results() = &results;

		ok = (UnitTest::CurrentTest::Results() == &results);
	}

	CHECK(ok);
}